

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall QPDFJob::initializeFromJson(QPDFJob *this,string *json,bool partial)

{
  JSONHandler *this_00;
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_01;
  _List_node_base *p_Var3;
  allocator<char> local_221;
  JSON j;
  __shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2> local_210;
  string local_200;
  __shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  ostringstream msg;
  __shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2> local_180;
  element_type *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_168;
  element_type *local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_158;
  element_type *local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_148;
  element_type *local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_138;
  element_type *local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_128;
  pointer local_120;
  pointer pbStack_118;
  pointer local_110;
  
  errors.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&errors;
  errors.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  errors.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       errors.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  JSON::parse(&j,json);
  std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1e0,(__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&JOB_SCHEMA);
  bVar1 = JSON::checkSchema(&j,(JSON *)&local_1e0,1,&errors);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
  if (bVar1) {
    config((QPDFJob *)&local_210);
    _msg = (pointer)0x0;
    std::__shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_180,&local_210);
    local_120 = (pointer)0x0;
    pbStack_118 = (pointer)0x0;
    local_130 = (element_type *)0x0;
    _Stack_128._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_140 = (element_type *)0x0;
    _Stack_138._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_150 = (element_type *)0x0;
    _Stack_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_160 = (element_type *)0x0;
    _Stack_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_170 = (element_type *)0x0;
    _Stack_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_110 = (pointer)0x0;
    anon_unknown.dwarf_3a08d6::Handlers::initHandlers((Handlers *)&msg);
    this_00 = pJRamfffffffffffffff0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,".",&local_221);
    std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1d0,(__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&j);
    JSONHandler::handle(this_00,&local_200,(JSON *)&local_1d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
    std::__cxx11::string::~string((string *)&local_200);
    anon_unknown.dwarf_3a08d6::Handlers::~Handlers((Handlers *)&msg);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_210._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&errors.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar2 = std::operator<<((ostream *)&msg,
                           (string *)
                           &((this->m).
                             super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->message_prefix);
  std::operator<<(poVar2,": job json has errors:");
  p_Var3 = (_List_node_base *)&errors;
  while (p_Var3 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&errors) {
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&msg);
    poVar2 = std::operator<<(poVar2,"  ");
    std::operator<<(poVar2,(string *)(p_Var3 + 1));
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_01,(string *)&local_200);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFJob::initializeFromJson(std::string const& json, bool partial)
{
    std::list<std::string> errors;
    JSON j = JSON::parse(json);
    if (!j.checkSchema(JOB_SCHEMA, JSON::f_optional, errors)) {
        std::ostringstream msg;
        msg << m->message_prefix << ": job json has errors:";
        for (auto const& error: errors) {
            msg << std::endl << "  " << error;
        }
        throw std::runtime_error(msg.str());
    }

    Handlers(partial, config()).handle(j);
}